

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

void __thiscall
StatisticsTracker::StatisticsTracker
          (StatisticsTracker *this,string *name,long count,double minimum,double mean,double maximum
          ,double variance,StatisticsTrackerOptions *options)

{
  pointer pcVar1;
  undefined3 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  
  this->_count = count;
  DynamicHistogram<double>::DynamicHistogram(&this->_histogram,&options->histogramOptions);
  this->_maximum = maximum;
  this->_mean = mean;
  this->_minimum = minimum;
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_name,pcVar1,pcVar1 + name->_M_string_length);
  uVar2 = *(undefined3 *)&(options->histogramOptions).field_0x9;
  (this->_options).histogramOptions.enabled = (options->histogramOptions).enabled;
  *(undefined3 *)&(this->_options).histogramOptions.field_0x9 = uVar2;
  bVar3 = options->doMax;
  bVar4 = options->doMean;
  bVar5 = options->doMin;
  bVar6 = options->doVar;
  uVar2 = *(undefined3 *)&options->field_0x5;
  iVar7 = (options->histogramOptions).binCount;
  iVar8 = (options->histogramOptions).cacheSize;
  (this->_options).doCov = options->doCov;
  (this->_options).doMax = bVar3;
  (this->_options).doMean = bVar4;
  (this->_options).doMin = bVar5;
  (this->_options).doVar = bVar6;
  *(undefined3 *)&(this->_options).field_0x5 = uVar2;
  (this->_options).histogramOptions.binCount = iVar7;
  (this->_options).histogramOptions.cacheSize = iVar8;
  this->_variance = variance;
  return;
}

Assistant:

StatisticsTracker(std::string name = "",
                      long count = 0,
                      double minimum = 0,
                      double mean = 0,
                      double maximum = 0,
                      double variance = 0,
                      StatisticsTrackerOptions const & options = StatisticsTrackerOptions()) :
        _count(count),
        _histogram(DynamicHistogram<double>(options.histogramOptions)),
        _maximum(maximum),
        _mean(mean),
        _minimum(minimum),
        _name(name),
        _options(options),
        _variance(variance)
    {
    }